

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void fts5SegIterAllocTombstone(Fts5Index *p,Fts5SegIter *pIter)

{
  int iVar1;
  Fts5TombstoneArray *pFVar2;
  
  iVar1 = pIter->pSeg->nPgTombstone;
  if (0 < iVar1) {
    pFVar2 = (Fts5TombstoneArray *)sqlite3Fts5MallocZero(&p->rc,(long)(iVar1 * 8 + 0x10));
    if (pFVar2 != (Fts5TombstoneArray *)0x0) {
      pFVar2->nTombstone = iVar1;
      pFVar2->nRef = 1;
      pIter->pTombArray = pFVar2;
    }
  }
  return;
}

Assistant:

static void fts5SegIterAllocTombstone(Fts5Index *p, Fts5SegIter *pIter){
  const int nTomb = pIter->pSeg->nPgTombstone;
  if( nTomb>0 ){
    int nByte = nTomb * sizeof(Fts5Data*) + sizeof(Fts5TombstoneArray);
    Fts5TombstoneArray *pNew;
    pNew = (Fts5TombstoneArray*)sqlite3Fts5MallocZero(&p->rc, nByte);
    if( pNew ){
      pNew->nTombstone = nTomb;
      pNew->nRef = 1;
      pIter->pTombArray = pNew;
    }
  }
}